

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

void __thiscall QTabBarPrivate::closeTab(QTabBarPrivate *this)

{
  QWidget *this_00;
  Tab *pTVar1;
  QWidget *pQVar2;
  int iVar3;
  QWidget *pQVar4;
  QStyle *pQVar5;
  int i;
  long lVar6;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar4 = (QWidget *)QObject::sender();
  pQVar5 = QWidget::style(this_00);
  lVar6 = 0;
  iVar3 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x5c,0,this_00,0);
  while( true ) {
    if ((this->tabList).d.size == lVar6) {
      return;
    }
    pTVar1 = (this->tabList).d.ptr[lVar6];
    if (iVar3 == 0) {
      pQVar2 = pTVar1->leftWidget;
    }
    else {
      pQVar2 = pTVar1->rightWidget;
    }
    if (pQVar2 == pQVar4) break;
    lVar6 = lVar6 + 1;
  }
  QTabBar::tabCloseRequested((QTabBar *)this_00,(int)lVar6);
  return;
}

Assistant:

void QTabBarPrivate::closeTab()
{
    Q_Q(QTabBar);
    QObject *object = q->sender();
    int tabToClose = -1;
    QTabBar::ButtonPosition closeSide = (QTabBar::ButtonPosition)q->style()->styleHint(QStyle::SH_TabBar_CloseButtonPosition, nullptr, q);
    for (int i = 0; i < tabList.size(); ++i) {
        if (closeSide == QTabBar::LeftSide) {
            if (tabList.at(i)->leftWidget == object) {
                tabToClose = i;
                break;
            }
        } else {
            if (tabList.at(i)->rightWidget == object) {
                tabToClose = i;
                break;
            }
        }
    }
    if (tabToClose != -1)
        emit q->tabCloseRequested(tabToClose);
}